

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

ma_result ma_pcm_rb_commit_write(ma_pcm_rb *pRB,ma_uint32 sizeInFrames)

{
  uint uVar1;
  ma_result mVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  
  mVar2 = MA_INVALID_ARGS;
  if (pRB != (ma_pcm_rb *)0x0) {
    uVar3 = (pRB->rb).encodedWriteOffset;
    uVar5 = (uVar3 & 0x7fffffff) + sizeInFrames * pRB->channels * (&DAT_0019eb10)[pRB->format];
    uVar1 = (pRB->rb).subbufferSizeInBytes;
    if (uVar5 <= uVar1) {
      uVar3 = uVar3 & 0x80000000;
      uVar4 = uVar3 | uVar5;
      if (uVar5 == uVar1) {
        uVar4 = uVar3 ^ 0x80000000;
      }
      LOCK();
      (pRB->rb).encodedWriteOffset = uVar4;
      UNLOCK();
      mVar2 = MA_SUCCESS;
    }
  }
  return mVar2;
}

Assistant:

MA_API ma_result ma_pcm_rb_commit_write(ma_pcm_rb* pRB, ma_uint32 sizeInFrames)
{
    if (pRB == NULL) {
        return MA_INVALID_ARGS;
    }

    return ma_rb_commit_write(&pRB->rb, sizeInFrames * ma_pcm_rb_get_bpf(pRB));
}